

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.h
# Opt level: O0

void __thiscall Timer::~Timer(Timer *this)

{
  bool bVar1;
  Timer *this_local;
  
  std::atomic<bool>::store(&this->tm_running,false,seq_cst);
  std::condition_variable::notify_all();
  bVar1 = std::thread::joinable(&this->tm_tick_thread);
  if (bVar1) {
    std::thread::join();
  }
  hash_map<int,_Timer::IdState>::~hash_map(&this->tm_id_state_map);
  Threadpool::~Threadpool(&this->tm_thread_pool);
  std::thread::~thread(&this->tm_tick_thread);
  std::condition_variable::~condition_variable(&this->tm_cond);
  std::
  priority_queue<Timer::TimerNode,_std::vector<Timer::TimerNode,_std::allocator<Timer::TimerNode>_>,_std::less<Timer::TimerNode>_>
  ::~priority_queue(&this->tm_queue);
  return;
}

Assistant:

~Timer()
    {
        tm_running.store(false);
        tm_cond.notify_all();
        if(tm_tick_thread.joinable())
        {
            tm_tick_thread.join();
        }
    }